

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O0

void __thiscall
jaegertracing::net::URI_testParseQueryValues_Test::TestBody(URI_testParseQueryValues_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer pvVar3;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>_>
  pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_838;
  bool local_82a;
  AssertHelper local_780 [8];
  Message local_778 [8];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_770;
  undefined1 local_768 [8];
  AssertionResult gtest_ar_14;
  Message local_750 [8];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_748;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_13;
  Message local_728 [8];
  size_type local_720;
  int local_714;
  undefined1 local_710 [8];
  AssertionResult gtest_ar_12;
  QueryValueMap values_1;
  allocator local_6c1;
  string local_6c0 [32];
  string local_6a0 [8];
  URI uri_1;
  AssertionResult local_618 [2];
  AssertHelper local_5f8 [8];
  Message local_5f0 [15];
  allocator local_5e1;
  string local_5e0 [32];
  string local_5c0 [136];
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_538 [63];
  bool local_4f9;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_4c8 [8];
  Message local_4c0 [15];
  bool local_4b1;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar__2;
  Message local_498 [8];
  undefined1 local_490 [8];
  AssertionResult gtest_ar_11;
  Message local_478 [8];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_470;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_468;
  difference_type local_460;
  int local_454;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_10;
  key_type local_438;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_418;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>_>
  test4;
  AssertHelper local_3e8 [8];
  Message local_3e0 [15];
  bool local_3d1;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__1;
  Message local_3b8 [8];
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_9;
  Message local_398 [8];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_390;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_388;
  difference_type local_380;
  int local_374;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_8;
  key_type local_358;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_338;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>_>
  test3;
  Message local_320 [8];
  undefined1 local_318 [8];
  AssertionResult gtest_ar_7;
  Message local_300 [8];
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_6;
  char *nextTest2Value;
  AssertHelper local_2c0 [8];
  Message local_2b8 [15];
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_;
  Message local_290 [8];
  undefined1 local_288 [8];
  AssertionResult gtest_ar_5;
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
  test2Itr;
  Message local_268 [8];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_260;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_258;
  difference_type local_250;
  int local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_4;
  key_type local_228;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_208;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>_>
  test2;
  Message local_1f0 [8];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_3;
  Message local_1d0 [8];
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_2;
  Message local_1b0 [8];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1a8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_1a0;
  difference_type local_198;
  int local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_1;
  key_type local_170;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_150;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>_>
  test1;
  AssertHelper local_138 [8];
  Message local_130 [8];
  size_type local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  QueryValueMap values;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [8];
  URI uri;
  URI_testParseQueryValues_Test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,"http://example.com?test1=1&test2=%6F&test2=r&test3&test4",&local_b9);
  jaegertracing::net::URI::parse(local_98);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  jaegertracing::net::URI::parseQueryValues_abi_cxx11_();
  local_11c = 5;
  local_128 = std::
              unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_118,"5","values.size()",&local_11c,&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (local_138,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(local_138,local_130);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    testing::Message::~Message(local_130);
  }
  test1.second.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  ._M_cur._5_3_ = 0;
  test1.second.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  ._M_cur._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  if (test1.second.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_170,"test1",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 7));
    pVar4 = std::
            unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::equal_range((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&gtest_ar.message_,&local_170);
    test1.first = pVar4.second.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur;
    local_150._M_cur =
         (__node_type *)
         pVar4.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
         ._M_cur;
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
    local_18c = 1;
    local_1a0._M_cur = local_150._M_cur;
    local_1a8 = test1.first.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur;
    local_198 = std::
                distance<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>>
                          ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                            )local_150._M_cur,test1.first);
    testing::internal::EqHelper<false>::Compare<int,long>
              ((EqHelper<false> *)local_188,"1","std::distance(test1.first, test1.second)",
               &local_18c,&local_198);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x51,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(local_1b0);
    }
    test1.second.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur._5_3_ = 0;
    test1.second.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    if (test1.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur._4_4_ == 0) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)&local_150);
      testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                ((EqHelper<false> *)local_1c8,"\"test1\"","test1.first->first",(char (*) [6])"test1"
                 ,&pvVar3->first);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
      if (!bVar1) {
        testing::Message::Message(local_1d0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                   ,0x52,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_1d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(local_1d0);
      }
      test1.second.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._5_3_ = 0;
      test1.second.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
      if (test1.second.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur._4_4_ == 0) {
        pvVar3 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                               *)&local_150);
        testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
                  ((EqHelper<false> *)local_1e8,"\"1\"","test1.first->second",(char (*) [2])0x344173
                   ,&pvVar3->second);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
        if (!bVar1) {
          testing::Message::Message(local_1f0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&test2.second,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                     ,0x53,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&test2.second,local_1f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test2.second);
          testing::Message::~Message(local_1f0);
        }
        test1.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur._5_3_ = 0;
        test1.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
        if (test1.second.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur._4_4_ == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_228,"test2",(allocator *)((long)&gtest_ar_4.message_.ptr_ + 7)
                    );
          pVar4 = std::
                  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::equal_range((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&gtest_ar.message_,&local_228);
          test2.first = pVar4.second.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur;
          local_208._M_cur =
               (__node_type *)
               pVar4.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._M_cur;
          std::__cxx11::string::~string((string *)&local_228);
          std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7))
          ;
          local_244 = 2;
          local_258._M_cur = local_208._M_cur;
          local_260 = test2.first.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur;
          local_250 = std::
                      distance<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>>
                                ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                  )local_208._M_cur,test2.first);
          testing::internal::EqHelper<false>::Compare<int,long>
                    ((EqHelper<false> *)local_240,"2","std::distance(test2.first, test2.second)",
                     &local_244,&local_250);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
          if (!bVar1) {
            testing::Message::Message(local_268);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&test2Itr,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                       ,0x56,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&test2Itr,local_268);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test2Itr);
            testing::Message::~Message(local_268);
          }
          test1.second.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur._5_3_ = 0;
          test1.second.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
          if (test1.second.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur._4_4_ == 0) {
            gtest_ar_5.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_208._M_cur;
            pvVar3 = std::__detail::
                     _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                     ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                   *)&gtest_ar_5.message_);
            testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                      ((EqHelper<false> *)local_288,"\"test2\"","test2Itr->first",
                       (char (*) [6])"test2",&pvVar3->first);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
            if (!bVar1) {
              testing::Message::Message(local_290);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                         ,0x58,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_.message_,local_290);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
              testing::Message::~Message(local_290);
            }
            test1.second.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur._5_3_ = 0;
            test1.second.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
            if (test1.second.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur._4_4_ == 0) {
              pvVar3 = std::__detail::
                       _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                       ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                     *)&gtest_ar_5.message_);
              bVar1 = std::operator==(&pvVar3->second,"o");
              local_82a = true;
              if (!bVar1) {
                pvVar3 = std::__detail::
                         _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                         ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                       *)&gtest_ar_5.message_);
                local_82a = std::operator==(&pvVar3->second,"r");
              }
              local_2a9 = local_82a;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
              if (!bVar1) {
                testing::Message::Message(local_2b8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((AssertionResult *)&nextTest2Value,local_2a8,
                           "test2Itr->second == \"o\" || test2Itr->second == \"r\"","false");
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (local_2c0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                           ,0x59,pcVar2);
                testing::internal::AssertHelper::operator=(local_2c0,local_2b8);
                testing::internal::AssertHelper::~AssertHelper(local_2c0);
                std::__cxx11::string::~string((string *)&nextTest2Value);
                testing::Message::~Message(local_2b8);
              }
              test1.second.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur._5_3_ = 0;
              test1.second.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
              if (test1.second.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur._4_4_ == 0) {
                pvVar3 = std::__detail::
                         _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                         ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                       *)&gtest_ar_5.message_);
                bVar1 = std::operator==(&pvVar3->second,"o");
                if (bVar1) {
                  local_838 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x347559;
                }
                else {
                  local_838 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x33b54a;
                }
                gtest_ar_6.message_.ptr_ = local_838;
                std::__detail::
                _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                              *)&gtest_ar_5.message_);
                pvVar3 = std::__detail::
                         _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                         ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                       *)&gtest_ar_5.message_);
                testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                          ((EqHelper<false> *)local_2f8,"\"test2\"","test2Itr->first",
                           (char (*) [6])"test2",&pvVar3->first);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2f8);
                if (!bVar1) {
                  testing::Message::Message(local_300);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                             ,0x5c,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_7.message_,local_300);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_7.message_);
                  testing::Message::~Message(local_300);
                }
                test1.second.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur._5_3_ = 0;
                test1.second.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
                if (test1.second.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur._4_4_ == 0) {
                  pvVar3 = std::__detail::
                           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                           ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                         *)&gtest_ar_5.message_);
                  testing::internal::EqHelper<false>::Compare<char_const*,std::__cxx11::string>
                            ((EqHelper<false> *)local_318,"nextTest2Value","test2Itr->second",
                             (char **)&gtest_ar_6.message_,&pvVar3->second);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_318);
                  if (!bVar1) {
                    testing::Message::Message(local_320);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&test3.second,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                               ,0x5d,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&test3.second,local_320);
                    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test3.second);
                    testing::Message::~Message(local_320);
                  }
                  test1.second.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur._5_3_ = 0;
                  test1.second.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                  if (test1.second.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur._4_4_ == 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_358,"test3",
                               (allocator *)((long)&gtest_ar_8.message_.ptr_ + 7));
                    pVar4 = std::
                            unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::equal_range((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&gtest_ar.message_,&local_358);
                    test3.first = pVar4.second.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                  ._M_cur;
                    local_338._M_cur =
                         (__node_type *)
                         pVar4.first.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                         ._M_cur;
                    std::__cxx11::string::~string((string *)&local_358);
                    std::allocator<char>::~allocator
                              ((allocator<char> *)((long)&gtest_ar_8.message_.ptr_ + 7));
                    local_374 = 1;
                    local_388._M_cur = local_338._M_cur;
                    local_390 = test3.first.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                ._M_cur;
                    local_380 = std::
                                distance<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>>
                                          ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                            )local_338._M_cur,test3.first);
                    testing::internal::EqHelper<false>::Compare<int,long>
                              ((EqHelper<false> *)local_370,"1",
                               "std::distance(test3.first, test3.second)",&local_374,&local_380);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_370);
                    if (!bVar1) {
                      testing::Message::Message(local_398);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_370);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                 ,0x60,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_9.message_,local_398);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_9.message_);
                      testing::Message::~Message(local_398);
                    }
                    test1.second.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur._5_3_ = 0;
                    test1.second.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
                    if (test1.second.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur._4_4_ == 0) {
                      pvVar3 = std::__detail::
                               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                             *)&local_338);
                      testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                                ((EqHelper<false> *)local_3b0,"\"test3\"","test3.first->first",
                                 (char (*) [6])"test3",&pvVar3->first);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_3b0);
                      if (!bVar1) {
                        testing::Message::Message(local_3b8);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_3b0);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                   ,0x61,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar__1.message_,local_3b8);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar__1.message_);
                        testing::Message::~Message(local_3b8);
                      }
                      test1.second.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur._5_3_ = 0;
                      test1.second.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                      ._M_cur._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
                      if (test1.second.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur._4_4_ == 0) {
                        std::__detail::
                        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                        ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                      *)&local_338);
                        local_3d1 = (bool)std::__cxx11::string::empty();
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_3d0,&local_3d1,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_3d0);
                        if (!bVar1) {
                          testing::Message::Message(local_3e0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((AssertionResult *)&test4.second,local_3d0,
                                     "test3.first->second.empty()","false");
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (local_3e8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                     ,0x62,pcVar2);
                          testing::internal::AssertHelper::operator=(local_3e8,local_3e0);
                          testing::internal::AssertHelper::~AssertHelper(local_3e8);
                          std::__cxx11::string::~string((string *)&test4.second);
                          testing::Message::~Message(local_3e0);
                        }
                        test1.second.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur._5_3_ = 0;
                        test1.second.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
                        if (test1.second.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur._4_4_ == 0) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_438,"test4",
                                     (allocator *)((long)&gtest_ar_10.message_.ptr_ + 7));
                          pVar4 = std::
                                  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::equal_range((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&gtest_ar.message_,&local_438);
                          test4.first = pVar4.second.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                        ._M_cur;
                          local_418._M_cur =
                               (__node_type *)
                               pVar4.first.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               ._M_cur;
                          std::__cxx11::string::~string((string *)&local_438);
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)((long)&gtest_ar_10.message_.ptr_ + 7));
                          local_454 = 1;
                          local_468._M_cur = local_418._M_cur;
                          local_470 = test4.first.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                      ._M_cur;
                          local_460 = std::
                                      distance<std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>>
                                                ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                                  )local_418._M_cur,test4.first);
                          testing::internal::EqHelper<false>::Compare<int,long>
                                    ((EqHelper<false> *)local_450,"1",
                                     "std::distance(test4.first, test4.second)",&local_454,
                                     &local_460);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_450);
                          if (!bVar1) {
                            testing::Message::Message(local_478);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_450);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                       ,0x65,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_11.message_,local_478);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_11.message_);
                            testing::Message::~Message(local_478);
                          }
                          test1.second.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur._5_3_ = 0;
                          test1.second.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
                          if (test1.second.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur._4_4_ == 0) {
                            pvVar3 = std::__detail::
                                     _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                     ::operator->((
                                                  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                                  *)&local_418);
                            testing::internal::EqHelper<false>::
                            Compare<char[6],std::__cxx11::string>
                                      ((EqHelper<false> *)local_490,"\"test4\"","test4.first->first"
                                       ,(char (*) [6])0x341fbb,&pvVar3->first);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_490);
                            if (!bVar1) {
                              testing::Message::Message(local_498);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_490);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                         ,0x66,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar__2.message_,local_498);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar__2.message_);
                              testing::Message::~Message(local_498);
                            }
                            test1.second.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur._5_3_ = 0;
                            test1.second.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._M_cur._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_490)
                            ;
                            if (test1.second.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                ._M_cur._4_4_ == 0) {
                              std::__detail::
                              _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                              ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                            *)&local_418);
                              local_4b1 = (bool)std::__cxx11::string::empty();
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_4b0,&local_4b1,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_4b0);
                              if (!bVar1) {
                                testing::Message::Message(local_4c0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((AssertionResult *)&gtest_ar__3.message_,local_4b0,
                                           "test4.first->second.empty()","false");
                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (local_4c8,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                                           ,0x67,pcVar2);
                                testing::internal::AssertHelper::operator=(local_4c8,local_4c0);
                                testing::internal::AssertHelper::~AssertHelper(local_4c8);
                                std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
                                testing::Message::~Message(local_4c0);
                              }
                              test1.second.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur._5_3_ = 0;
                              test1.second.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              ._M_cur._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_4b0);
                              if (test1.second.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                  ._M_cur._4_4_ == 0) {
                                test1.second.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                ._M_cur._4_4_ = 0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_multimap
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gtest_ar.message_);
  URI::~URI((URI *)local_98);
  if (test1.second.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5e0,"http://example.com",&local_5e1);
    jaegertracing::net::URI::parse(local_5c0);
    jaegertracing::net::URI::parseQueryValues_abi_cxx11_();
    local_4f9 = std::
                unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty(local_538);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_4f8,&local_4f9,(type *)0x0);
    std::
    unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_multimap(local_538);
    URI::~URI((URI *)local_5c0);
    std::__cxx11::string::~string(local_5e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
    if (!bVar1) {
      testing::Message::Message(local_5f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_618,local_4f8,"URI::parse(\"http://example.com\").parseQueryValues().empty()"
                 ,"false");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_5f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                 ,0x6a,pcVar2);
      testing::internal::AssertHelper::operator=(local_5f8,local_5f0);
      testing::internal::AssertHelper::~AssertHelper(local_5f8);
      std::__cxx11::string::~string((string *)local_618);
      testing::Message::~Message(local_5f0);
    }
    test1.second.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur._5_3_ = 0;
    test1.second.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
    if (test1.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6c0,"http://example.com?key=value",&local_6c1);
      jaegertracing::net::URI::parse(local_6a0);
      std::__cxx11::string::~string(local_6c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
      jaegertracing::net::URI::parseQueryValues_abi_cxx11_();
      local_714 = 1;
      local_720 = std::
                  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::size((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&gtest_ar_12.message_);
      testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                ((EqHelper<false> *)local_710,"1","values.size()",&local_714,&local_720);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
      if (!bVar1) {
        testing::Message::Message(local_728);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_710);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                   ,0x6f,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_728);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
        testing::Message::~Message(local_728);
      }
      test1.second.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._5_3_ = 0;
      test1.second.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
      if (test1.second.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur._4_4_ == 0) {
        local_748._M_cur =
             (__node_type *)
             std::
             begin<std::unordered_multimap<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                       ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&gtest_ar_12.message_);
        pvVar3 = std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                               *)&local_748);
        testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
                  ((EqHelper<false> *)local_740,"\"key\"","std::begin(values)->first",
                   (char (*) [4])0x347d9c,&pvVar3->first);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
        if (!bVar1) {
          testing::Message::Message(local_750);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_740);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                     ,0x70,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_14.message_,local_750);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
          testing::Message::~Message(local_750);
        }
        test1.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur._5_3_ = 0;
        test1.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
        if (test1.second.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur._4_4_ == 0) {
          local_770._M_cur =
               (__node_type *)
               std::
               begin<std::unordered_multimap<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                         ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&gtest_ar_12.message_);
          pvVar3 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                 *)&local_770);
          testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
                    ((EqHelper<false> *)local_768,"\"value\"","std::begin(values)->second",
                     (char (*) [6])0x33e03d,&pvVar3->second);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_768);
          if (!bVar1) {
            testing::Message::Message(local_778);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_768);
            testing::internal::AssertHelper::AssertHelper
                      (local_780,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/URITest.cpp"
                       ,0x71,pcVar2);
            testing::internal::AssertHelper::operator=(local_780,local_778);
            testing::internal::AssertHelper::~AssertHelper(local_780);
            testing::Message::~Message(local_778);
          }
          test1.second.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur._5_3_ = 0;
          test1.second.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_768);
          if (test1.second.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur._4_4_ == 0) {
            test1.second.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur._4_4_ = 0;
          }
        }
      }
      std::
      unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_multimap
                ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&gtest_ar_12.message_);
      URI::~URI((URI *)local_6a0);
    }
  }
  return;
}

Assistant:

TEST(URI, testParseQueryValues)
{
    {
        const auto uri = URI::parse(
            "http://example.com?test1=1&test2=%6F&test2=r&test3&test4");
        const auto values = uri.parseQueryValues();
        ASSERT_EQ(5, values.size());

        const auto test1 = values.equal_range("test1");
        ASSERT_EQ(1, std::distance(test1.first, test1.second));
        ASSERT_EQ("test1", test1.first->first);
        ASSERT_EQ("1", test1.first->second);

        const auto test2 = values.equal_range("test2");
        ASSERT_EQ(2, std::distance(test2.first, test2.second));
        auto test2Itr = test2.first;
        ASSERT_EQ("test2", test2Itr->first);
        ASSERT_TRUE(test2Itr->second == "o" || test2Itr->second == "r");
        auto nextTest2Value = (test2Itr->second == "o") ? "r" : "o";
        ++test2Itr;
        ASSERT_EQ("test2", test2Itr->first);
        ASSERT_EQ(nextTest2Value, test2Itr->second);

        const auto test3 = values.equal_range("test3");
        ASSERT_EQ(1, std::distance(test3.first, test3.second));
        ASSERT_EQ("test3", test3.first->first);
        ASSERT_TRUE(test3.first->second.empty());

        const auto test4 = values.equal_range("test4");
        ASSERT_EQ(1, std::distance(test4.first, test4.second));
        ASSERT_EQ("test4", test4.first->first);
        ASSERT_TRUE(test4.first->second.empty());
    }

    ASSERT_TRUE(URI::parse("http://example.com").parseQueryValues().empty());

    {
        const auto uri = URI::parse("http://example.com?key=value");
        const auto values = uri.parseQueryValues();
        ASSERT_EQ(1, values.size());
        ASSERT_EQ("key", std::begin(values)->first);
        ASSERT_EQ("value", std::begin(values)->second);
    }
}